

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.hpp
# Opt level: O2

int __thiscall qclab::io::QASMFile::parseQubit(QASMFile *this,string *str)

{
  int iVar1;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"]",&local_51);
  left_of(&local_50,str,&local_30);
  iVar1 = read_value<int>(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int parseQubit( std::string& str ) const {
        return read_value< int >( left_of( str , "]" ) ) ;
      }